

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O0

void * Bac_ManInsertAbc(Bac_Man_t *p,void *pAbc)

{
  Bac_Man_t *pNew_00;
  Bac_Man_t *pNew;
  Abc_Ntk_t *pNtk;
  void *pAbc_local;
  Bac_Man_t *p_local;
  
  pNew_00 = Bac_ManDupUserBoxes(p);
  Bac_ManMarkNodesAbc(p,(Abc_Ntk_t *)pAbc);
  Bac_ManRemapBarbufs(pNew_00,p);
  Bac_NtkInsertNtk(pNew_00,(Abc_Ntk_t *)pAbc);
  Bac_ManMoveNames(pNew_00,p);
  return pNew_00;
}

Assistant:

void * Bac_ManInsertAbc( Bac_Man_t * p, void * pAbc )
{
    Abc_Ntk_t * pNtk = (Abc_Ntk_t *)pAbc;
    Bac_Man_t * pNew = Bac_ManDupUserBoxes( p );
    Bac_ManMarkNodesAbc( p, pNtk );
    Bac_ManRemapBarbufs( pNew, p );
    Bac_NtkInsertNtk( pNew, pNtk );
    Bac_ManMoveNames( pNew, p );
    return pNew;
}